

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2OrderParameter.cpp
# Opt level: O0

void __thiscall
OpenMD::P2OrderParameter::P2OrderParameter
          (P2OrderParameter *this,SimInfo *info,string *filename,string *sele1,int seleOffset)

{
  string *in_RCX;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  SimInfo *in_stack_00000048;
  SelectionEvaluator *in_stack_00000050;
  SimInfo *in_stack_000001f8;
  SelectionManager *in_stack_00000200;
  undefined8 in_stack_ffffffffffffff48;
  string *filename_00;
  string *in_stack_ffffffffffffff50;
  StaticAnalyser *this_00;
  SimInfo *in_stack_ffffffffffffff58;
  string *str;
  StaticAnalyser *in_stack_ffffffffffffff60;
  string local_78 [16];
  string *in_stack_ffffffffffffff98;
  SelectionEvaluator *in_stack_ffffffffffffffa0;
  string local_58 [52];
  undefined4 local_24;
  string *local_20;
  
  local_24 = in_R8D;
  local_20 = in_RCX;
  StaticAnalyser::StaticAnalyser
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
             (uint)((ulong)in_stack_ffffffffffffff48 >> 0x20));
  *in_RDI = &PTR__P2OrderParameter_0055fbb0;
  *(undefined1 *)(in_RDI + 0x1a) = 0;
  *(undefined1 *)((long)in_RDI + 0xd1) = 1;
  std::__cxx11::string::string((string *)(in_RDI + 0x1b),local_20);
  std::__cxx11::string::string((string *)(in_RDI + 0x1f));
  SelectionManager::SelectionManager(in_stack_00000200,in_stack_000001f8);
  SelectionManager::SelectionManager(in_stack_00000200,in_stack_000001f8);
  str = (string *)(in_RDI + 0x55);
  SelectionEvaluator::SelectionEvaluator(in_stack_00000050,in_stack_00000048);
  this_00 = (StaticAnalyser *)(in_RDI + 0xff);
  SelectionEvaluator::SelectionEvaluator(in_stack_00000050,in_stack_00000048);
  *(undefined4 *)(in_RDI + 0x1a9) = local_24;
  filename_00 = (string *)(in_RDI + 0x1aa);
  std::
  vector<OpenMD::P2OrderParameter::OrderParam,_std::allocator<OpenMD::P2OrderParameter::OrderParam>_>
  ::vector((vector<OpenMD::P2OrderParameter::OrderParam,_std::allocator<OpenMD::P2OrderParameter::OrderParam>_>
            *)0x1910d6);
  getPrefix(str);
  std::operator+(str,(char *)this_00);
  StaticAnalyser::setOutputName(this_00,filename_00);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_78);
  SelectionEvaluator::loadScriptString(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  return;
}

Assistant:

P2OrderParameter::P2OrderParameter(SimInfo* info, const string& filename,
                                     const string& sele1, int seleOffset) :
      StaticAnalyser(info, filename, 1),
      doVect_(false), doOffset_(true), selectionScript1_(sele1),
      seleMan1_(info), seleMan2_(info), evaluator1_(info), evaluator2_(info),
      seleOffset_(seleOffset) {
    setOutputName(getPrefix(filename) + ".p2");

    evaluator1_.loadScriptString(sele1);
  }